

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::StartNextTestsOnTimer(cmCTestMultiProcessHandler *this)

{
  uint uVar1;
  _func_void_uv_timer_t_ptr *cb;
  uint local_24;
  __0 local_15;
  uint local_14;
  cmCTestMultiProcessHandler *pcStack_10;
  uint milliseconds;
  cmCTestMultiProcessHandler *this_local;
  
  pcStack_10 = this;
  if (this->FakeLoadForTesting == 0) {
    uVar1 = cmSystemTools::RandomSeed();
    local_24 = (uVar1 % 5 + 1) * 1000;
  }
  else {
    local_24 = 10;
  }
  local_14 = local_24;
  cb = StartNextTestsOnTimer()::$_0::operator_cast_to_function_pointer(&local_15);
  ::cm::uv_timer_ptr::start(&this->StartNextTestsOnTimer_,cb,(ulong)local_14,0);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::StartNextTestsOnTimer()
{
  // Wait between 1 and 5 seconds before trying again.
  unsigned int const milliseconds = this->FakeLoadForTesting
    ? 10
    : (cmSystemTools::RandomSeed() % 5 + 1) * 1000;
  this->StartNextTestsOnTimer_.start(
    [](uv_timer_t* timer) {
      uv_timer_stop(timer);
      auto* self = static_cast<cmCTestMultiProcessHandler*>(timer->data);
      self->StartNextTests();
    },
    milliseconds, 0);
}